

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unixmake.cpp
# Opt level: O3

QStringList * __thiscall
UnixMakefileGenerator::findDependencies(UnixMakefileGenerator *this,QString *f)

{
  QMakeProject *pQVar1;
  QString *pQVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  Data *pDVar5;
  char16_t *pcVar6;
  bool bVar7;
  char cVar8;
  int iVar9;
  QStringList *this_00;
  ProStringList *pPVar10;
  iterator sub;
  iterator iVar11;
  QList<ProString> *pQVar12;
  iterator other;
  iterator iVar13;
  iterator this_01;
  iterator iVar14;
  ProString *pPVar15;
  ulong uVar16;
  ProString *compiler;
  ProString *arch;
  ProString *pPVar17;
  long in_FS_OFFSET;
  QByteArrayView QVar18;
  QLatin1String QVar19;
  QByteArrayView QVar20;
  QByteArrayView QVar21;
  QLatin1String QVar22;
  QStringView config;
  QStringView config_00;
  QStringView QVar23;
  ProString language;
  ProString extensionSuffix;
  ProString file;
  QStringBuilder<QStringBuilder<QString_&,_ProString_&>,_QString_&> local_180;
  QArrayDataPointer<ProString> local_168;
  undefined1 local_148 [32];
  undefined1 *puStack_128;
  undefined1 *local_120;
  undefined1 local_118 [40];
  undefined1 *puStack_f0;
  QString local_d8;
  undefined1 local_b8 [32];
  undefined1 *local_98;
  undefined1 *puStack_90;
  QString local_88;
  undefined1 local_68 [32];
  undefined1 *local_48;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = MakefileGenerator::findDependencies(&this->super_MakefileGenerator,f);
  iVar9 = (*(this->super_MakefileGenerator).super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo
            [0x21])(this);
  if ((char)iVar9 == '\0') goto LAB_001ab296;
  pQVar1 = (this->super_MakefileGenerator).project;
  ProKey::ProKey((ProKey *)local_118,"PRECOMPILED_HEADER");
  bVar7 = QMakeProject::isEmpty(pQVar1,(ProKey *)local_118);
  if ((QArrayData *)local_118._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_118._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_118._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_118._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_118._0_8_,2,0x10);
    }
  }
  if (bVar7) goto LAB_001ab296;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_68._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_68._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_68._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_68._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  ProString::ProString((ProString *)local_68,f);
  local_88.d.d = (Data *)0x0;
  local_88.d.ptr = (char16_t *)0x0;
  local_88.d.size = 0;
  pQVar1 = (this->super_MakefileGenerator).project;
  ProKey::ProKey((ProKey *)local_118,"PRECOMPILED_DIR");
  bVar7 = QMakeProject::isEmpty(pQVar1,(ProKey *)local_118);
  if ((QArrayData *)local_118._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_118._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_118._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_118._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_118._0_8_,2,0x10);
    }
  }
  if (!bVar7) {
    pQVar1 = (this->super_MakefileGenerator).project;
    ProKey::ProKey((ProKey *)local_b8,"PRECOMPILED_DIR");
    QMakeEvaluator::first((ProString *)local_118,&pQVar1->super_QMakeEvaluator,(ProKey *)local_b8);
    ProString::toQString((QString *)local_148,(ProString *)local_118);
    pcVar6 = local_88.d.ptr;
    pDVar5 = local_88.d.d;
    uVar4 = local_148._16_8_;
    uVar3 = local_148._0_8_;
    local_148._0_8_ = local_88.d.d;
    local_88.d.d = (Data *)uVar3;
    local_88.d.ptr = (char16_t *)local_148._8_8_;
    local_148._8_8_ = pcVar6;
    local_148._16_8_ = local_88.d.size;
    local_88.d.size = uVar4;
    if (&pDVar5->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&pDVar5->super_QArrayData,2,0x10);
      }
    }
    if ((QArrayData *)local_118._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_118._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_118._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_118._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_118._0_8_,2,0x10);
      }
    }
    if ((QArrayData *)local_b8._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_b8._0_8_,2,0x10);
      }
    }
  }
  pQVar1 = (this->super_MakefileGenerator).project;
  ProKey::ProKey((ProKey *)local_b8,"QMAKE_ORIG_TARGET");
  QMakeEvaluator::first((ProString *)local_118,&pQVar1->super_QMakeEvaluator,(ProKey *)local_b8);
  ProString::toQString((QString *)local_148,(ProString *)local_118);
  QString::append((QString *)&local_88);
  if ((QArrayData *)local_148._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_148._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_148._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_148._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_148._0_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_118._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_118._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_118._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_118._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_118._0_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_b8._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_b8._0_8_,2,0x10);
    }
  }
  pQVar1 = (this->super_MakefileGenerator).project;
  ProKey::ProKey((ProKey *)local_b8,"QMAKE_PCH_OUTPUT_EXT");
  QMakeEvaluator::first((ProString *)local_118,&pQVar1->super_QMakeEvaluator,(ProKey *)local_b8);
  ProString::toQString((QString *)local_148,(ProString *)local_118);
  QString::append((QString *)&local_88);
  if ((QArrayData *)local_148._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_148._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_148._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_148._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_148._0_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_118._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_118._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_118._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_118._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_118._0_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_b8._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_b8._0_8_,2,0x10);
    }
  }
  pQVar1 = (this->super_MakefileGenerator).project;
  QVar18.m_data = (storage_type *)0xd;
  QVar18.m_size = (qsizetype)local_118;
  QString::fromUtf8(QVar18);
  uVar3 = local_118._0_8_;
  config.m_data = (storage_type_conflict *)local_118._8_8_;
  config.m_size = local_118._16_8_;
  bVar7 = QMakeEvaluator::isActiveConfig(&pQVar1->super_QMakeEvaluator,config,false);
  if ((QArrayData *)uVar3 != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)uVar3)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)uVar3)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)uVar3)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)uVar3,2,0x10);
    }
  }
  if (bVar7) {
    pQVar1 = (this->super_MakefileGenerator).project;
    ProKey::ProKey((ProKey *)local_118,"QMAKE_PCH_ARCHS");
    pPVar10 = QMakeEvaluator::valuesRef(&pQVar1->super_QMakeEvaluator,(ProKey *)local_118);
    local_b8._0_8_ = (pPVar10->super_QList<ProString>).d.d;
    local_b8._8_8_ = (pPVar10->super_QList<ProString>).d.ptr;
    local_b8._16_8_ = (pPVar10->super_QList<ProString>).d.size;
    if ((QArrayData *)local_b8._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)&((QArrayData *)local_b8._0_8_)->ref_)->ref_)._q_value.
      super___atomic_base<int>._M_i =
           (((QArrayData *)&((QArrayData *)local_b8._0_8_)->ref_)->ref_)._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    if ((QArrayData *)local_118._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_118._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_118._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_118._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_118._0_8_,2,0x10);
      }
    }
    if ((char *)local_b8._16_8_ == (char *)0x0) {
      ProString::ProString((ProString *)local_118);
      QtPrivate::QMovableArrayOps<ProString>::emplace<ProString_const&>
                ((QMovableArrayOps<ProString> *)local_b8,local_b8._16_8_,(ProString *)local_118);
      QList<ProString>::end((QList<ProString> *)local_b8);
      if ((QArrayData *)local_118._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_118._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_118._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_118._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_118._0_8_,2,0x10);
        }
      }
      if ((char *)local_b8._16_8_ != (char *)0x0) goto LAB_001aa93b;
    }
    else {
LAB_001aa93b:
      pPVar15 = (ProString *)(local_b8._8_8_ + local_b8._16_8_ * 0x30);
      pPVar17 = (ProString *)local_b8._8_8_;
      do {
        local_118._0_8_ = local_88.d.d;
        local_118._8_8_ = local_88.d.ptr;
        local_118._16_8_ = local_88.d.size;
        if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        if (pPVar17->m_length != 0) {
          ProString::toQString((QString *)local_148,pPVar17);
          QVar19.m_data = (char *)0x11;
          QVar19.m_size = (qsizetype)local_118;
          QString::replace(QVar19,(QString *)"${QMAKE_PCH_ARCH}",
                           (CaseSensitivity)(QString *)local_148);
          if ((QArrayData *)local_148._0_8_ != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)local_148._0_8_)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)local_148._0_8_)->_q_value).super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if ((((QBasicAtomicInt *)local_148._0_8_)->_q_value).super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate((QArrayData *)local_148._0_8_,2,0x10);
            }
          }
        }
        for (sub = QList<QString>::begin(&Option::cpp_ext);
            iVar11 = QList<QString>::end(&Option::cpp_ext), sub.i != iVar11.i; sub.i = sub.i + 1) {
          bVar7 = ProString::endsWith((ProString *)local_68,sub.i,CaseSensitive);
          if (bVar7) {
            QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                      ((QMovableArrayOps<QString> *)this_00,(this_00->d).size,(QString *)local_118);
            QList<QString>::end(this_00);
            break;
          }
        }
        if ((QArrayData *)local_118._0_8_ != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_118._0_8_)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_118._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)local_118._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)local_118._0_8_,2,0x10);
          }
        }
        pPVar17 = pPVar17 + 1;
      } while (pPVar17 != pPVar15);
    }
    QArrayDataPointer<ProString>::~QArrayDataPointer((QArrayDataPointer<ProString> *)local_b8);
  }
  else {
    local_d8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_d8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_d8.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    pQVar1 = (this->super_MakefileGenerator).project;
    QVar20.m_data = (storage_type *)0xf;
    QVar20.m_size = (qsizetype)local_118;
    QString::fromUtf8(QVar20);
    uVar3 = local_118._0_8_;
    config_00.m_data = (storage_type_conflict *)local_118._8_8_;
    config_00.m_size = local_118._16_8_;
    bVar7 = QMakeEvaluator::isActiveConfig(&pQVar1->super_QMakeEvaluator,config_00,false);
    if (bVar7) {
      pQVar1 = (this->super_MakefileGenerator).project;
      ProKey::ProKey((ProKey *)local_b8,"QMAKE_PCH_OUTPUT_EXT");
      QMakeEvaluator::first((ProString *)local_118,&pQVar1->super_QMakeEvaluator,(ProKey *)local_b8)
      ;
      ProString::toQString(&local_d8,(ProString *)local_118);
      if ((QArrayData *)local_118._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_118._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_118._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_118._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_118._0_8_,2,0x10);
        }
      }
      if ((QArrayData *)local_b8._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_b8._0_8_,2,0x10);
        }
      }
    }
    else {
      QVar21.m_data = (storage_type *)0x0;
      QVar21.m_size = (qsizetype)local_118;
      QString::fromUtf8(QVar21);
      local_d8.d.d = (Data *)local_118._0_8_;
      local_d8.d.ptr = (char16_t *)local_118._8_8_;
      local_d8.d.size = local_118._16_8_;
    }
    if ((QArrayData *)uVar3 != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)uVar3)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)uVar3)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)uVar3)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)uVar3,2,0x10);
      }
    }
    pQVar1 = (this->super_MakefileGenerator).project;
    ProKey::ProKey((ProKey *)local_148,"QMAKE_PRECOMP_PREFIX");
    QMakeEvaluator::first((ProString *)local_b8,&pQVar1->super_QMakeEvaluator,(ProKey *)local_148);
    local_118._0_8_ = &Option::dir_sep;
    ProString::ProString((ProString *)(local_118 + 8),(ProString *)local_b8);
    ::operator+=(&local_88,(QStringBuilder<QString_&,_ProString> *)local_118);
    if ((ProString *)local_118._8_8_ != (ProString *)0x0) {
      LOCK();
      *(int *)&(((QString *)local_118._8_8_)->d).d =
           *(int *)&(((QString *)local_118._8_8_)->d).d + -1;
      UNLOCK();
      if (*(int *)&(((QString *)local_118._8_8_)->d).d == 0) {
        QArrayData::deallocate((QArrayData *)local_118._8_8_,2,0x10);
      }
    }
    if ((QArrayData *)local_b8._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_b8._0_8_,2,0x10);
      }
    }
    if ((QArrayData *)local_148._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_148._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_148._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_148._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_148._0_8_,2,0x10);
      }
    }
    pQVar1 = (this->super_MakefileGenerator).project;
    ProKey::ProKey((ProKey *)local_118,"QMAKE_BUILTIN_COMPILERS");
    pQVar12 = &QMakeEvaluator::valuesRef(&pQVar1->super_QMakeEvaluator,(ProKey *)local_118)->
               super_QList<ProString>;
    if ((QArrayData *)local_118._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_118._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_118._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_118._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_118._0_8_,2,0x10);
      }
    }
    other = QList<ProString>::begin(pQVar12);
    iVar13 = QList<ProString>::end(pQVar12);
    if (other.i != iVar13.i) {
      do {
        pQVar1 = (this->super_MakefileGenerator).project;
        local_b8._0_8_ = "QMAKE_";
        local_b8._16_8_ = "FLAGS_PRECOMPILE";
        local_b8._8_8_ = other.i;
        ProString::ProString<QStringBuilder<char_const(&)[7],ProString_const&>,char_const(&)[17]>
                  ((ProString *)local_118,
                   (QStringBuilder<QStringBuilder<const_char_(&)[7],_const_ProString_&>,_const_char_(&)[17]>
                    *)local_b8);
        bVar7 = QMakeProject::isEmpty(pQVar1,(ProKey *)local_118);
        if ((QArrayData *)local_118._0_8_ != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_118._0_8_)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_118._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)local_118._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)local_118._0_8_,2,0x10);
          }
        }
        if (!bVar7) {
          local_118._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
          puStack_f0 = &DAT_aaaaaaaaaaaaaaaa;
          local_118._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_118._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_118._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_118._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
          pQVar1 = (this->super_MakefileGenerator).project;
          local_148._0_8_ = anon_var_dwarf_2befc5;
          local_148._8_8_ = other.i;
          ProString::ProString<char_const(&)[16],ProString_const&>
                    ((ProString *)local_b8,
                     (QStringBuilder<const_char_(&)[16],_const_ProString_&> *)local_148);
          QMakeEvaluator::first
                    ((ProString *)local_118,&pQVar1->super_QMakeEvaluator,(ProKey *)local_b8);
          if ((QArrayData *)local_b8._0_8_ != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate((QArrayData *)local_b8._0_8_,2,0x10);
            }
          }
          if (local_118._28_4_ == 0) {
            uVar16 = 0;
          }
          else {
            local_98 = &DAT_aaaaaaaaaaaaaaaa;
            puStack_90 = &DAT_aaaaaaaaaaaaaaaa;
            local_b8._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
            local_b8._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
            local_b8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
            local_b8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
            ProString::ProString((ProString *)local_b8,other.i);
            bVar7 = ProString::operator==((ProString *)local_b8,"CXX");
            if (bVar7) {
              ProString::ProString((ProString *)local_148,"CPP");
              QString::operator=((QString *)local_b8,(QString *)local_148);
              puStack_90 = local_120;
              local_b8._24_8_ = local_148._24_8_;
              local_98 = puStack_128;
              if ((QArrayData *)local_148._0_8_ != (QArrayData *)0x0) {
                LOCK();
                (((QBasicAtomicInt *)local_148._0_8_)->_q_value).super___atomic_base<int>._M_i =
                     (((QBasicAtomicInt *)local_148._0_8_)->_q_value).super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if ((((QBasicAtomicInt *)local_148._0_8_)->_q_value).super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate((QArrayData *)local_148._0_8_,2,0x10);
                }
              }
            }
            pQVar1 = (this->super_MakefileGenerator).project;
            local_168.d = (Data *)0x2aca56;
            local_168.ptr = (ProString *)local_b8;
            ProString::ProString<char_const(&)[11],ProString&>
                      ((ProString *)local_148,
                       (QStringBuilder<const_char_(&)[11],_ProString_&> *)&local_168);
            pQVar12 = &QMakeEvaluator::valuesRef(&pQVar1->super_QMakeEvaluator,(ProKey *)local_148)
                       ->super_QList<ProString>;
            if ((QArrayData *)local_148._0_8_ != (QArrayData *)0x0) {
              LOCK();
              (((QBasicAtomicInt *)local_148._0_8_)->_q_value).super___atomic_base<int>._M_i =
                   (((QBasicAtomicInt *)local_148._0_8_)->_q_value).super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if ((((QBasicAtomicInt *)local_148._0_8_)->_q_value).super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate((QArrayData *)local_148._0_8_,2,0x10);
              }
            }
            this_01 = QList<ProString>::begin(pQVar12);
            iVar14 = QList<ProString>::end(pQVar12);
            uVar16 = 0;
            if (this_01.i != iVar14.i) {
LAB_001aaf30:
              ProString::toQString((QString *)local_148,this_01.i);
              bVar7 = ProString::endsWith((ProString *)local_68,(QString *)local_148,CaseSensitive);
              if ((QArrayData *)local_148._0_8_ != (QArrayData *)0x0) {
                LOCK();
                (((QBasicAtomicInt *)local_148._0_8_)->_q_value).super___atomic_base<int>._M_i =
                     (((QBasicAtomicInt *)local_148._0_8_)->_q_value).super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if ((((QBasicAtomicInt *)local_148._0_8_)->_q_value).super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate((QArrayData *)local_148._0_8_,2,0x10);
                }
              }
              if (!bVar7) goto code_r0x001aaf7b;
              local_168.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
              local_168.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
              local_168.ptr = (ProString *)&DAT_aaaaaaaaaaaaaaaa;
              pQVar1 = (this->super_MakefileGenerator).project;
              ProKey::ProKey((ProKey *)local_148,"QMAKE_PCH_ARCHS");
              pPVar10 = QMakeEvaluator::valuesRef(&pQVar1->super_QMakeEvaluator,(ProKey *)local_148)
              ;
              local_168.d = (pPVar10->super_QList<ProString>).d.d;
              local_168.ptr = (pPVar10->super_QList<ProString>).d.ptr;
              local_168.size = (pPVar10->super_QList<ProString>).d.size;
              if (local_168.d != (Data *)0x0) {
                LOCK();
                ((local_168.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     ((local_168.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                     1;
                UNLOCK();
              }
              if ((QArrayData *)local_148._0_8_ != (QArrayData *)0x0) {
                LOCK();
                (((QBasicAtomicInt *)local_148._0_8_)->_q_value).super___atomic_base<int>._M_i =
                     (((QBasicAtomicInt *)local_148._0_8_)->_q_value).super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if ((((QBasicAtomicInt *)local_148._0_8_)->_q_value).super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate((QArrayData *)local_148._0_8_,2,0x10);
                }
              }
              if (local_168.size == 0) {
                ProString::ProString((ProString *)local_148);
                QtPrivate::QMovableArrayOps<ProString>::emplace<ProString_const&>
                          ((QMovableArrayOps<ProString> *)&local_168,local_168.size,
                           (ProString *)local_148);
                QList<ProString>::end((QList<ProString> *)&local_168);
                if ((QArrayData *)local_148._0_8_ != (QArrayData *)0x0) {
                  LOCK();
                  (((QBasicAtomicInt *)local_148._0_8_)->_q_value).super___atomic_base<int>._M_i =
                       (((QBasicAtomicInt *)local_148._0_8_)->_q_value).super___atomic_base<int>.
                       _M_i + -1;
                  UNLOCK();
                  if ((((QBasicAtomicInt *)local_148._0_8_)->_q_value).super___atomic_base<int>._M_i
                      == 0) {
                    QArrayData::deallocate((QArrayData *)local_148._0_8_,2,0x10);
                  }
                }
                if (local_168.size == 0) goto LAB_001ab195;
              }
              pPVar15 = local_168.ptr + local_168.size;
              pPVar17 = local_168.ptr;
              do {
                local_148._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
                local_148._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
                local_148._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
                local_180.a.a = &local_88;
                local_180.a.b = (ProString *)local_118;
                local_180.b = &local_d8;
                QStringBuilder<QStringBuilder<QString_&,_ProString_&>,_QString_&>::
                convertTo<QString>((QString *)local_148,&local_180);
                if (pPVar17->m_length != 0) {
                  ProString::toQString((QString *)&local_180,pPVar17);
                  QVar22.m_data = (char *)0x11;
                  QVar22.m_size = (qsizetype)local_148;
                  QString::replace(QVar22,(QString *)"${QMAKE_PCH_ARCH}",(CaseSensitivity)&local_180
                                  );
                  pQVar2 = local_180.a.a;
                  if ((QArrayData *)local_180.a.a != (QArrayData *)0x0) {
                    LOCK();
                    *(int *)&((local_180.a.a)->d).d = *(int *)&((local_180.a.a)->d).d + -1;
                    UNLOCK();
                    if (*(int *)&(pQVar2->d).d == 0) {
                      QArrayData::deallocate((QArrayData *)local_180.a.a,2,0x10);
                    }
                  }
                }
                QVar23.m_data = (storage_type_conflict *)local_148._8_8_;
                QVar23.m_size = local_148._16_8_;
                cVar8 = QtPrivate::QStringList_contains((QList *)this_00,QVar23,CaseSensitive);
                if (cVar8 == '\0') {
                  QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                            ((QMovableArrayOps<QString> *)this_00,(this_00->d).size,
                             (QString *)local_148);
                  QList<QString>::end(this_00);
                }
                if ((QArrayData *)local_148._0_8_ != (QArrayData *)0x0) {
                  LOCK();
                  (((QBasicAtomicInt *)local_148._0_8_)->_q_value).super___atomic_base<int>._M_i =
                       (((QBasicAtomicInt *)local_148._0_8_)->_q_value).super___atomic_base<int>.
                       _M_i + -1;
                  UNLOCK();
                  if ((((QBasicAtomicInt *)local_148._0_8_)->_q_value).super___atomic_base<int>._M_i
                      == 0) {
                    QArrayData::deallocate((QArrayData *)local_148._0_8_,2,0x10);
                  }
                }
                pPVar17 = pPVar17 + 1;
              } while (pPVar17 != pPVar15);
LAB_001ab195:
              QArrayDataPointer<ProString>::~QArrayDataPointer(&local_168);
              uVar16 = 0xd;
            }
LAB_001ab1ac:
            if ((QArrayData *)local_b8._0_8_ != (QArrayData *)0x0) {
              LOCK();
              (((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i =
                   (((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if ((((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0
                 ) {
                QArrayData::deallocate((QArrayData *)local_b8._0_8_,2,0x10);
              }
            }
          }
          if ((QArrayData *)local_118._0_8_ != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)local_118._0_8_)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)local_118._0_8_)->_q_value).super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if ((((QBasicAtomicInt *)local_118._0_8_)->_q_value).super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate((QArrayData *)local_118._0_8_,2,0x10);
            }
          }
          if ((uVar16 & 7) != 0) break;
        }
        other.i = other.i + 1;
      } while (other.i != iVar13.i);
    }
    if (&(local_d8.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_d8.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,0x10);
    }
  }
  if ((QArrayData *)local_68._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_68._0_8_,2,0x10);
    }
  }
LAB_001ab296:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return this_00;
code_r0x001aaf7b:
  this_01.i = this_01.i + 1;
  if (this_01.i == iVar14.i) goto LAB_001ab1ac;
  goto LAB_001aaf30;
}

Assistant:

QStringList
&UnixMakefileGenerator::findDependencies(const QString &f)
{
    QStringList &ret = MakefileGenerator::findDependencies(f);
    if (doPrecompiledHeaders() && !project->isEmpty("PRECOMPILED_HEADER")) {
        ProString file = f;
        QString header_prefix;
        if(!project->isEmpty("PRECOMPILED_DIR"))
            header_prefix = project->first("PRECOMPILED_DIR").toQString();
        header_prefix += project->first("QMAKE_ORIG_TARGET").toQString();
        header_prefix += project->first("QMAKE_PCH_OUTPUT_EXT").toQString();
        if (project->isActiveConfig("icc_pch_style")) {
            // icc style
            ProStringList pchArchs = project->values("QMAKE_PCH_ARCHS");
            if (pchArchs.isEmpty())
                pchArchs << ProString(); // normal single-arch PCH
            for (const ProString &arch : std::as_const(pchArchs)) {
                auto pfx = header_prefix;
                if (!arch.isEmpty())
                    pfx.replace(QLatin1String("${QMAKE_PCH_ARCH}"), arch.toQString());
                for (QStringList::Iterator it = Option::cpp_ext.begin();
                    it != Option::cpp_ext.end(); ++it) {
                    if (file.endsWith(*it)) {
                        ret += pfx;
                        break;
                    }
                }
            }
        } else {
            // gcc style (including clang_pch_style)
            QString header_suffix = project->isActiveConfig("clang_pch_style")
                    ? project->first("QMAKE_PCH_OUTPUT_EXT").toQString() : "";
            header_prefix += Option::dir_sep + project->first("QMAKE_PRECOMP_PREFIX");

            for (const ProString &compiler : project->values("QMAKE_BUILTIN_COMPILERS")) {
                if (project->isEmpty(ProKey("QMAKE_" + compiler + "FLAGS_PRECOMPILE")))
                    continue;

                ProString language = project->first(ProKey("QMAKE_LANGUAGE_" + compiler));
                if (language.isEmpty())
                    continue;

                // Unfortunately we were not consistent about the C++ naming
                ProString extensionSuffix = compiler;
                if (extensionSuffix == "CXX")
                    extensionSuffix = ProString("CPP");

                for (const ProString &extension : project->values(ProKey("QMAKE_EXT_" + extensionSuffix))) {
                    if (!file.endsWith(extension.toQString()))
                        continue;

                    ProStringList pchArchs = project->values("QMAKE_PCH_ARCHS");
                    if (pchArchs.isEmpty())
                        pchArchs << ProString(); // normal single-arch PCH
                    for (const ProString &arch : std::as_const(pchArchs)) {
                        QString precompiledHeader = header_prefix + language + header_suffix;
                        if (!arch.isEmpty()) {
                            precompiledHeader.replace(QLatin1String("${QMAKE_PCH_ARCH}"),
                                                      arch.toQString());
                        }
                        if (!ret.contains(precompiledHeader))
                            ret += precompiledHeader;
                    }

                    goto foundPrecompiledDependency;
                }
            }
          foundPrecompiledDependency:
            ; // Hurray!!
        }
    }
    return ret;
}